

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS
ref_node_tri_grad_nodes(REF_NODE ref_node,REF_INT *nodes,REF_DBL *scalar,REF_DBL *gradient)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_168;
  double local_158;
  double local_150;
  double local_140;
  double local_138;
  double local_128;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT i;
  REF_DBL norm01 [3];
  double local_e8;
  REF_DBL norm02 [3];
  double local_c8;
  REF_DBL edge01 [3];
  double local_a8;
  REF_DBL edge02 [3];
  REF_DBL local_88;
  REF_DBL grad2 [3];
  REF_DBL local_68;
  REF_DBL grad1 [3];
  REF_DBL side_length;
  REF_DBL dot;
  REF_DBL area2;
  REF_DBL *gradient_local;
  REF_DBL *scalar_local;
  REF_INT *nodes_local;
  REF_NODE ref_node_local;
  
  *gradient = 0.0;
  gradient[1] = 0.0;
  gradient[2] = 0.0;
  area2 = (REF_DBL)gradient;
  gradient_local = scalar;
  scalar_local = (REF_DBL *)nodes;
  nodes_local = &ref_node->n;
  uVar1 = ref_node_tri_area(ref_node,nodes,&dot);
  if (uVar1 == 0) {
    dot = dot * 2.0;
    for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 3;
        ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
      edge01[(long)ref_private_macro_code_rss_1 + -1] =
           *(double *)
            (*(long *)(nodes_local + 0xe) +
            (long)(ref_private_macro_code_rss_1 + *(int *)((long)scalar_local + 4) * 0xf) * 8) -
           *(double *)
            (*(long *)(nodes_local + 0xe) +
            (long)(ref_private_macro_code_rss_1 + *(int *)scalar_local * 0xf) * 8);
    }
    for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 3;
        ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
      edge02[(long)ref_private_macro_code_rss_1 + -1] =
           *(double *)
            (*(long *)(nodes_local + 0xe) +
            (long)(ref_private_macro_code_rss_1 + *(int *)(scalar_local + 1) * 0xf) * 8) -
           *(double *)
            (*(long *)(nodes_local + 0xe) +
            (long)(ref_private_macro_code_rss_1 + *(int *)scalar_local * 0xf) * 8);
    }
    for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 3;
        ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
      *(REF_DBL *)(&ref_private_macro_code_rss + (long)ref_private_macro_code_rss_1 * 2) =
           edge01[(long)ref_private_macro_code_rss_1 + -1];
    }
    for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 3;
        ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
      norm02[(long)ref_private_macro_code_rss_1 + -1] =
           edge02[(long)ref_private_macro_code_rss_1 + -1];
    }
    uVar1 = ref_math_normalize((REF_DBL *)&ref_private_macro_code_rss);
    if (uVar1 == 0) {
      uVar1 = ref_math_normalize(&local_e8);
      if (uVar1 == 0) {
        dVar2 = edge01[0] * norm02[0];
        dVar3 = edge01[1] * norm02[1];
        dVar4 = sqrt(edge02[1] * edge02[1] + local_a8 * local_a8 + edge02[0] * edge02[0]);
        for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 3;
            ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
          grad1[(long)ref_private_macro_code_rss_1 + -1] =
               -(dVar3 + local_c8 * local_e8 + dVar2) *
               norm02[(long)ref_private_macro_code_rss_1 + -1] +
               edge01[(long)ref_private_macro_code_rss_1 + -1];
        }
        uVar1 = ref_math_normalize(&local_68);
        if (uVar1 == 0) {
          for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 3;
              ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
            grad1[(long)ref_private_macro_code_rss_1 + -1] =
                 dVar4 * grad1[(long)ref_private_macro_code_rss_1 + -1];
          }
          dVar2 = sqrt(edge01[1] * edge01[1] + local_c8 * local_c8 + edge01[0] * edge01[0]);
          for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 3;
              ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
            grad2[(long)ref_private_macro_code_rss_1 + -1] =
                 -(edge02[1] * norm01[1] +
                  local_a8 * _ref_private_macro_code_rss + edge02[0] * norm01[0]) *
                 *(double *)(&ref_private_macro_code_rss + (long)ref_private_macro_code_rss_1 * 2) +
                 edge02[(long)ref_private_macro_code_rss_1 + -1];
          }
          uVar1 = ref_math_normalize(&local_88);
          if (uVar1 == 0) {
            for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 3;
                ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
              grad2[(long)ref_private_macro_code_rss_1 + -1] =
                   dVar2 * grad2[(long)ref_private_macro_code_rss_1 + -1];
            }
            for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 3;
                ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
              *(double *)((long)area2 + (long)ref_private_macro_code_rss_1 * 8) =
                   (gradient_local[*(int *)((long)scalar_local + 4)] -
                   gradient_local[*(int *)scalar_local]) *
                   grad1[(long)ref_private_macro_code_rss_1 + -1] +
                   (gradient_local[*(int *)(scalar_local + 1)] -
                   gradient_local[*(int *)scalar_local]) *
                   grad2[(long)ref_private_macro_code_rss_1 + -1];
            }
            if (dot * 1e+20 <= 0.0) {
              local_128 = -(dot * 1e+20);
            }
            else {
              local_128 = dot * 1e+20;
            }
            if (*(double *)area2 <= 0.0) {
              local_138 = -*(double *)area2;
            }
            else {
              local_138 = *(double *)area2;
            }
            if (local_138 < local_128) {
              if (dot * 1e+20 <= 0.0) {
                local_140 = -(dot * 1e+20);
              }
              else {
                local_140 = dot * 1e+20;
              }
              if (*(double *)((long)area2 + 8) <= 0.0) {
                local_150 = -*(double *)((long)area2 + 8);
              }
              else {
                local_150 = *(double *)((long)area2 + 8);
              }
              if (local_150 < local_140) {
                if (dot * 1e+20 <= 0.0) {
                  local_158 = -(dot * 1e+20);
                }
                else {
                  local_158 = dot * 1e+20;
                }
                if (*(double *)((long)area2 + 0x10) <= 0.0) {
                  local_168 = -*(double *)((long)area2 + 0x10);
                }
                else {
                  local_168 = *(double *)((long)area2 + 0x10);
                }
                if (local_168 < local_158) {
                  *(double *)area2 = *(double *)area2 / dot;
                  *(double *)((long)area2 + 8) = *(double *)((long)area2 + 8) / dot;
                  *(double *)((long)area2 + 0x10) = *(double *)((long)area2 + 0x10) / dot;
                  return 0;
                }
              }
            }
            *(undefined8 *)area2 = 0;
            *(undefined8 *)((long)area2 + 8) = 0;
            *(undefined8 *)((long)area2 + 0x10) = 0;
            ref_node_local._4_4_ = 4;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0xcea,"ref_node_tri_grad_nodes",(ulong)uVar1,"normalize zero length grad2");
            ref_node_local._4_4_ = uVar1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0xce4,"ref_node_tri_grad_nodes",(ulong)uVar1,"normalize zero length grad1");
          ref_node_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0xcdf,"ref_node_tri_grad_nodes",(ulong)uVar1,"normalize zero length n0 -> n2");
        ref_node_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xcde,
             "ref_node_tri_grad_nodes",(ulong)uVar1,"normalize zero length n0 -> n1");
      ref_node_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xcd2,
           "ref_node_tri_grad_nodes",(ulong)uVar1,"area");
    ref_node_local._4_4_ = uVar1;
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_grad_nodes(REF_NODE ref_node, REF_INT *nodes,
                                           REF_DBL *scalar, REF_DBL *gradient) {
  REF_DBL area2, dot, side_length;
  REF_DBL grad1[3], grad2[3], edge02[3], edge01[3], norm02[3], norm01[3];
  REF_INT i;
  gradient[0] = 0.0;
  gradient[1] = 0.0;
  gradient[2] = 0.0;

  RSS(ref_node_tri_area(ref_node, nodes, &area2), "area");
  area2 *= 2;

  for (i = 0; i < 3; i++)
    edge01[i] = ref_node_xyz(ref_node, i, nodes[1]) -
                ref_node_xyz(ref_node, i, nodes[0]);
  for (i = 0; i < 3; i++)
    edge02[i] = ref_node_xyz(ref_node, i, nodes[2]) -
                ref_node_xyz(ref_node, i, nodes[0]);

  for (i = 0; i < 3; i++) norm01[i] = edge01[i];
  for (i = 0; i < 3; i++) norm02[i] = edge02[i];
  RSS(ref_math_normalize(norm01), "normalize zero length n0 -> n1");
  RSS(ref_math_normalize(norm02), "normalize zero length n0 -> n2");

  dot = ref_math_dot(edge01, norm02);
  side_length = sqrt(ref_math_dot(edge02, edge02));
  for (i = 0; i < 3; i++) grad1[i] = edge01[i] - dot * norm02[i];
  RSS(ref_math_normalize(grad1), "normalize zero length grad1");
  for (i = 0; i < 3; i++) grad1[i] *= side_length;

  dot = ref_math_dot(edge02, norm01);
  side_length = sqrt(ref_math_dot(edge01, edge01));
  for (i = 0; i < 3; i++) grad2[i] = edge02[i] - dot * norm01[i];
  RSS(ref_math_normalize(grad2), "normalize zero length grad2");
  for (i = 0; i < 3; i++) grad2[i] *= side_length;

  for (i = 0; i < 3; i++)
    gradient[i] = (scalar[nodes[1]] - scalar[nodes[0]]) * grad1[i] +
                  (scalar[nodes[2]] - scalar[nodes[0]]) * grad2[i];

  if (ref_math_divisible(gradient[0], area2) &&
      ref_math_divisible(gradient[1], area2) &&
      ref_math_divisible(gradient[2], area2)) {
    gradient[0] /= area2;
    gradient[1] /= area2;
    gradient[2] /= area2;
  } else {
    gradient[0] = 0.0;
    gradient[1] = 0.0;
    gradient[2] = 0.0;
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}